

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RadiusDamageSelf
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  bool bVar1;
  int iVar2;
  VMValue *pVVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  VMValue *pVVar6;
  AActor *this;
  uint uVar7;
  char *pcVar8;
  PClassActor *type;
  int iVar9;
  double dVar10;
  DAngle angle;
  double local_60;
  FName local_54;
  undefined8 local_50;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003db3fa;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003db3cb:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003db3fa:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x558,
                  "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003db167;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003db3fa;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003db3cb;
LAB_003db167:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pVVar3 = defaultparam->Array;
    if (pVVar3[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db44a:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x559,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar9 = pVVar3[1].field_0.i;
LAB_003db1ba:
    if (pVVar3[2].field_0.field_3.Type != '\x01') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003db469:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x55a,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_60 = pVVar3[2].field_0.f;
LAB_003db1c9:
    if (pVVar3[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db419:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x55b,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar7 = pVVar3[3].field_0.i;
LAB_003db1d7:
    if (pVVar3[4].field_0.field_3.Type == '\x03') {
      pVVar6 = pVVar3 + 4;
      if (pVVar3[4].field_0.field_1.atag == 1) goto LAB_003db1eb;
      if ((pVVar6->field_0).field_1.a == (void *)0x0) {
LAB_003db200:
        type = (PClassActor *)0x0;
        goto LAB_003db209;
      }
    }
    pcVar8 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
    ;
LAB_003db3db:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x55c,
                  "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar8 = "(param[paramnum]).Type == REGT_INT";
    goto LAB_003db44a;
  }
  iVar9 = param[1].field_0.i;
  if ((uint)numparam < 3) {
    pVVar3 = defaultparam->Array;
    goto LAB_003db1ba;
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
    goto LAB_003db469;
  }
  local_60 = param[2].field_0.f;
  if (numparam == 3) {
    pVVar3 = defaultparam->Array;
    goto LAB_003db1c9;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar8 = "(param[paramnum]).Type == REGT_INT";
    goto LAB_003db419;
  }
  uVar7 = param[3].field_0.i;
  if ((uint)numparam < 5) {
    pVVar3 = defaultparam->Array;
    goto LAB_003db1d7;
  }
  if (param[4].field_0.field_3.Type != '\x03') {
LAB_003db3b9:
    pcVar8 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
    goto LAB_003db3db;
  }
  pVVar6 = param + 4;
  if (param[4].field_0.field_1.atag != 1) {
    if ((pVVar6->field_0).field_1.a != (void *)0x0) goto LAB_003db3b9;
    goto LAB_003db200;
  }
LAB_003db1eb:
  type = (PClassActor *)(pVVar6->field_0).field_1.a;
LAB_003db209:
  obj = &this->target;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar10 = AActor::Distance3D(this,pAVar4,false);
  if (dVar10 < local_60) {
    iVar9 = iVar9 - (int)((dVar10 * (double)iVar9) / local_60);
    if ((uVar7 & 1) != 0) {
      iVar2 = iVar9;
      if (iVar9 < 1) {
        iVar2 = 0;
      }
      iVar9 = 0;
      while (bVar1 = iVar2 != 0, iVar2 = iVar2 + -1, bVar1) {
        uVar7 = FRandom::operator()(&pr_bfgselfdamage);
        iVar9 = iVar9 + (uVar7 & 7) + 1;
      }
    }
    uVar7 = 0;
    iVar2 = 200;
    if (type != (PClassActor *)0x0) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_48.Z = pAVar5->Height * 0.25 + (pAVar4->__Pos).Z;
      local_48.X = (pAVar4->__Pos).X;
      local_48.Y = (pAVar4->__Pos).Y;
      iVar2 = 200;
      pAVar4 = Spawn(type,&local_48,ALLOW_REPLACE);
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->flags5).Value & 0x800000) != 0) {
          (pAVar4->target).field_0 = obj->field_0;
        }
        uVar7 = (pAVar4->flags7).Value & 0x80 | (pAVar4->flags3).Value >> 0x13 & 0x40;
        iVar2 = (pAVar4->DamageType).super_FName.Index;
      }
    }
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    local_50 = 0;
    local_54.Index = iVar2;
    iVar2 = P_DamageMobj(pAVar4,this,pAVar5,iVar9,&local_54,uVar7,angle);
    if (0 < iVar2) {
      iVar9 = iVar2;
    }
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    P_TraceBleed(iVar9,pAVar4,this);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusDamageSelf)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(damage);
	PARAM_FLOAT_DEF(distance);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(flashtype, AActor);

	int 				i;
	int 				damageSteps;
	int 				actualDamage;
	double 				actualDistance;

	actualDistance = self->Distance3D(self->target);
	if (actualDistance < distance)
	{
		// [XA] Decrease damage with distance. Use the BFG damage
		//      calculation formula if the flag is set (essentially
		//      a generalization of SMMU's BFG11K behavior, used
		//      with fraggle's blessing.)
		damageSteps = damage - int(damage * actualDistance / distance);
		if (flags & RDSF_BFGDAMAGE)
		{
			actualDamage = 0;
			for (i = 0; i < damageSteps; ++i)
				actualDamage += (pr_bfgselfdamage() & 7) + 1;
		}
		else
		{
			actualDamage = damageSteps;
		}

		// optional "flash" effect -- spawn an actor on
		// the player to indicate bad things happened.
		AActor *flash = NULL;
		if(flashtype != NULL)
			flash = Spawn(flashtype, self->target->PosPlusZ(self->target->Height / 4), ALLOW_REPLACE);

		int dmgFlags = 0;
		FName dmgType = NAME_BFGSplash;

		if (flash != NULL)
		{
			if (flash->flags5 & MF5_PUFFGETSOWNER) flash->target = self->target;
			if (flash->flags3 & MF3_FOILINVUL) dmgFlags |= DMG_FOILINVUL;
			if (flash->flags7 & MF7_FOILBUDDHA) dmgFlags |= DMG_FOILBUDDHA;
			dmgType = flash->DamageType;
		}

		int newdam = P_DamageMobj(self->target, self, self->target, actualDamage, dmgType, dmgFlags);
		P_TraceBleed(newdam > 0 ? newdam : actualDamage, self->target, self);
	}

	return 0;
}